

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitConstantArgsToIntArray
               (ByteCodeGenerator *byteCodeGenerator,int32 *vars,ParseNode *args,uint argCount)

{
  code *pcVar1;
  OpCode OVar2;
  undefined4 *puVar3;
  ParseNodeBin *pPVar4;
  ParseNodeInt *pPVar5;
  ulong uVar6;
  bool bVar7;
  
  OVar2 = args->nop;
  bVar7 = argCount != 0;
  uVar6 = 0;
  if (bVar7 && OVar2 == knopList) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar6 = 0;
    do {
      pPVar4 = ParseNode::AsParseNodeBin(args);
      if (pPVar4->pnode1->nop != knopInt) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1e4e,"(args->AsParseNodeBin()->pnode1->nop == knopInt)",
                           "args->AsParseNodeBin()->pnode1->nop == knopInt");
        if (!bVar7) goto LAB_0081d00a;
        *puVar3 = 0;
      }
      pPVar4 = ParseNode::AsParseNodeBin(args);
      pPVar5 = ParseNode::AsParseNodeInt(pPVar4->pnode1);
      vars[uVar6] = pPVar5->lw;
      uVar6 = uVar6 + 1;
      pPVar4 = ParseNode::AsParseNodeBin(args);
      args = pPVar4->pnode2;
      OVar2 = args->nop;
      bVar7 = uVar6 < argCount;
    } while ((OVar2 == knopList) && (uVar6 < argCount));
  }
  if (!bVar7) {
    Js::Throw::InternalError();
  }
  if (OVar2 != knopInt) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1e59,"(args->nop == knopInt)","args->nop == knopInt");
    if (!bVar7) goto LAB_0081d00a;
    *puVar3 = 0;
  }
  pPVar5 = ParseNode::AsParseNodeInt(args);
  vars[uVar6 & 0xffffffff] = pPVar5->lw;
  if ((int)uVar6 + 1U != argCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1e5c,"(index == argCount)","index == argCount");
    if (!bVar7) {
LAB_0081d00a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void EmitConstantArgsToIntArray(ByteCodeGenerator *byteCodeGenerator, __out_ecount(argCount) int32 *vars, ParseNode *args, uint argCount)
{
    uint index = 0;
    while (args->nop == knopList && index < argCount)
    {
        Assert(args->AsParseNodeBin()->pnode1->nop == knopInt);
        vars[index++] = args->AsParseNodeBin()->pnode1->AsParseNodeInt()->lw;
        args = args->AsParseNodeBin()->pnode2;
    }

    if (index >= argCount)
    {
        Js::Throw::InternalError();
        return;
    }

    Assert(args->nop == knopInt);
    vars[index++] = args->AsParseNodeInt()->lw;

    Assert(index == argCount);
}